

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

openmode __thiscall
cppforth::Forth::GetFileAccessMode(Forth *this,Cell handler,string *function,errorCodes ec)

{
  bool bVar1;
  reference pFVar2;
  ulong uVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_38;
  __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
  local_30;
  iterator it;
  errorCodes ec_local;
  string *function_local;
  Cell handler_local;
  Forth *this_local;
  
  it._M_current._4_4_ = ec;
  local_30._M_current =
       (ForthFile *)
       std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::begin
                 (&this->OpenFiles);
  do {
    local_38._M_current =
         (ForthFile *)
         std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>::end
                   (&this->OpenFiles);
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                      (&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::operator+(&local_58,function,": wrong file handler access");
      throwMessage(this,&local_58,it._M_current._4_4_);
      std::__cxx11::string::~string((string *)&local_58);
      uVar4 = __cxa_rethrow();
      std::__cxx11::string::~string((string *)&local_58);
      _Unwind_Resume(uVar4);
    }
    pFVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
             ::operator*(&local_30);
    if (pFVar2->FILE == handler) {
      pFVar2 = __gnu_cxx::
               __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
               ::operator*(&local_30);
      std::
      __shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&pFVar2->fileObject);
      uVar3 = std::fstream::is_open();
      if ((uVar3 & 1) != 0) {
        pFVar2 = __gnu_cxx::
                 __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
                 ::operator*(&local_30);
        return pFVar2->fileAccessMode;
      }
    }
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::ForthFile_*,_std::vector<cppforth::Forth::ForthFile,_std::allocator<cppforth::Forth::ForthFile>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

std::ios_base::openmode GetFileAccessMode(Cell handler, const std::string& function, errorCodes ec = errorAbort) {
	for (auto it = OpenFiles.begin(); it != OpenFiles.end(); ++it) {
		if ((*it).FILE == handler && (*it).fileObject->is_open()) {
			return (*it).fileAccessMode;
		}
	}
	throwMessage(function + ": wrong file handler access", ec);
	throw;
}